

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sarray2.c
# Opt level: O3

void * SparseArrayFind(SparseArray *sarray,uint32_t *index)

{
  SparseArray *sarray_00;
  void *pvVar1;
  byte bVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  
  uVar3 = *index;
  bVar2 = (byte)sarray->shift;
  uVar4 = uVar3 >> (bVar2 & 0x1f);
  if (sarray->shift == 0) {
    uVar5 = (ulong)(uVar4 & 0xff);
    do {
      uVar3 = uVar3 + 1;
      if (sarray->data[uVar5] != (void *)0x0) {
        return sarray->data[uVar5];
      }
      *index = uVar3;
      uVar5 = uVar5 + 1;
    } while (uVar5 != 0x100);
  }
  else if ((char)uVar4 != -1) {
    uVar5 = (ulong)(uVar4 & 0xff);
    do {
      sarray_00 = (SparseArray *)sarray->data[uVar5];
      if ((((sarray_00 == &EmptyArray24) || (sarray_00 == &EmptyArray16)) ||
          (sarray_00 == &EmptyArray)) || (sarray_00 == &EmptyArray8)) {
        *index = (1 << ((byte)sarray->shift & 0x1f)) + *index & ~((0xff << (bVar2 & 0x1f)) >> 8);
      }
      else {
        pvVar1 = SparseArrayFind(sarray_00,index);
        if (pvVar1 != (void *)0x0) {
          return pvVar1;
        }
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 != 0xff);
  }
  return (void *)0x0;
}

Assistant:

static void *SparseArrayFind(SparseArray * sarray, uint32_t * index)
{
	uint32_t j = MASK_INDEX((*index));
	uint32_t max = MAX_INDEX(sarray);
	if (sarray->shift == 0)
	{
		while (j<=max)
		{
			if (sarray->data[j] != SARRAY_EMPTY)
			{
				return sarray->data[j];
			}
			(*index)++;
			j++;
		}
	}
	else while (j<max)
	{
		// If the shift is not 0, then we need to recursively look at child
		// nodes.
		uint32_t zeromask = ~((0xff << sarray->shift) >> base_shift);
		while (j<max)
		{
			//Look in child nodes
			SparseArray *child = sarray->data[j];
			// Skip over known-empty children
			if ((&EmptyArray == child) ||
			    (&EmptyArray8 == child) ||
			    (&EmptyArray16 == child) ||
			    (&EmptyArray24 == child))
			{
				//Add 2^n to index so j is still correct
				(*index) += 1<<sarray->shift;
				//Zero off the next component of the index so we don't miss any.
				*index &= zeromask;
			}
			else
			{
				// The recursive call will set index to the correct value for
				// the next index, but won't update j
				void * ret = SparseArrayFind(child, index);
				if (ret != SARRAY_EMPTY)
				{
					return ret;
				}
			}
			//Go to the next child
			j++;
		}
	}
	return SARRAY_EMPTY;
}